

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O0

commodityNameMap * units::commodities::loadDefinedCommodities_abi_cxx11_(void)

{
  const_iterator pvVar1;
  unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  *in_RDI;
  value_type *ccode;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::pair<const_char_*,_unsigned_int>,_1213UL> *__range2;
  commodityNameMap *knownCommodities;
  
  memset(in_RDI,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)in_RDI);
  __end2 = std::array<std::pair<const_char_*,_unsigned_int>,_1213UL>::begin
                     ((array<std::pair<const_char_*,_unsigned_int>,_1213UL> *)
                      defined_commodity_codes);
  pvVar1 = std::array<std::pair<const_char_*,_unsigned_int>,_1213UL>::end
                     ((array<std::pair<const_char_*,_unsigned_int>,_1213UL> *)
                      defined_commodity_codes);
  for (; __end2 != pvVar1; __end2 = __end2 + 1) {
    if (__end2->first != (char *)0x0) {
      std::
      unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::emplace<char_const*const&,unsigned_int_const&>(in_RDI,&__end2->first,&__end2->second);
    }
  }
  return (commodityNameMap *)in_RDI;
}

Assistant:

static commodityNameMap loadDefinedCommodities()
    {
        commodityNameMap knownCommodities{};
        for (const auto& ccode : defined_commodity_codes) {
            if (ccode.first != nullptr) {
                knownCommodities.emplace(ccode.first, ccode.second);
            }
        }
        return knownCommodities;
    }